

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::check_type_exists(Parser *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  bVar1 = Tokenizer::type_exists(this->tokenizer,&this->cur_token);
  if (bVar1) {
    return;
  }
  std::operator+(&local_30,"Compiler Error: \'",&this->cur_token);
  std::operator+(&local_50,&local_30,"\' is not a valid type");
  std::operator<<((ostream *)&std::cerr,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  exit(0);
}

Assistant:

void Parser::check_type_exists() {
    // types defined by language + user defined types
    if (!tokenizer.type_exists(cur_token)) {
        std::cerr << "Compiler Error: '" + cur_token + "' is not a valid type";
        exit(0);
    }
}